

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  Offset OVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  Offset OVar5;
  Offset OVar6;
  Type local_58;
  string local_50;
  
  if (this->in_function_body == true) {
    OVar5 = this->current_opcode_offset;
    OVar1 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset;
    if (((this->super_BinaryReaderObjdumpBase).options_)->section_offsets == false) {
      OVar6 = 0;
    }
    else {
      OVar6 = (this->super_BinaryReaderObjdumpBase).section_starts_[10];
    }
    local_58 = type;
    printf(" %06zx:",OVar5 - OVar6);
    uVar4 = OVar1 - OVar5;
    if (uVar4 != 0) {
      uVar2 = 9;
      if (uVar4 < 9) {
        uVar2 = uVar4;
      }
      lVar3 = uVar2 + (uVar2 == 0);
      OVar6 = OVar5;
      do {
        printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[OVar6]);
        OVar6 = OVar6 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if (uVar4 < 9) {
      lVar3 = (OVar5 - OVar1) + 9;
      do {
        printf("   ");
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    printf(" | local[");
    if (count != 0) {
      printf("%u",(ulong)this->local_index_);
      if (count != 1) {
        printf("..%u",(ulong)((count + this->local_index_) - 1));
      }
      this->local_index_ = this->local_index_ + count;
    }
    Type::GetName_abi_cxx11_(&local_50,&local_58);
    printf("] type=%s\n",local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    OVar5 = uVar4 + this->current_opcode_offset;
    this->last_opcode_end = OVar5;
    this->current_opcode_offset = OVar5;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", GetPrintOffset(offset));
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[");
  if (count > 0) {
    printf("%" PRIindex, local_index_);

    if (count != 1) {
      printf("..%" PRIindex "", local_index_ + count - 1);
    }
    local_index_ += count;
  }
  printf("] type=%s\n", type.GetName().c_str());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}